

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void tpl_model_update_b(TplParams *tpl_data,int mi_row,int mi_col,BLOCK_SIZE bsize,int frame_idx,
                       int ref)

{
  uint8_t right_shift;
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  FULLPEL_MV FVar8;
  int ref_pos;
  int bsize_pix;
  int bsize_pix_00;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long srcrf_dist_00;
  long lVar16;
  int64_t iVar17;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  TplDepStats *des_stats;
  int ref_mi_col;
  int ref_mi_row;
  int overlap_area;
  int grid_pos_col;
  int grid_pos_row;
  int64_t mc_dep_rate;
  int64_t delta_rate;
  int64_t mc_dep_dist;
  int64_t cur_dep_dist;
  int64_t srcrf_rate;
  int64_t srcrf_dist;
  int block;
  int grid_pos_col_base;
  int grid_pos_row_base;
  int pix_num;
  int mi_width;
  int mi_height;
  int bh;
  int bw;
  int ref_pos_col;
  int ref_pos_row;
  FULLPEL_MV full_mv;
  TplDepStats *ref_stats_ptr;
  TplDepFrame *ref_tpl_frame;
  int ref_frame_index;
  int is_compound;
  TplDepStats *tpl_stats_ptr;
  uint8_t block_mis_log2;
  TplDepFrame *tpl_frame;
  TplDepStats *tpl_ptr;
  TplDepFrame *tpl_frame_ptr;
  int local_f4;
  uint local_8c;
  short local_64;
  short sStack_62;
  
  lVar14 = *(long *)(*(long *)(in_RDI + 0x4ff0) + (long)in_R8D * 0x60 + 8);
  lVar5 = *(long *)(in_RDI + 0x4ff0);
  right_shift = *(uint8_t *)(in_RDI + 4);
  iVar7 = av1_tpl_ptr_pos(in_ESI,in_EDX,*(int *)(lVar5 + 0x40),right_shift);
  lVar14 = lVar14 + (long)iVar7 * 200;
  cVar1 = *(char *)(lVar14 + 0xc1);
  if (-1 < *(char *)(lVar14 + 0xc0 + (long)in_R9D)) {
    iVar7 = (int)*(char *)(lVar14 + 0xc0 + (long)in_R9D);
    lVar15 = lVar5 + (long)*(int *)(lVar5 + (long)in_R8D * 0x60 + 0x20 + (long)iVar7 * 4) * 0x60;
    lVar6 = *(long *)(lVar15 + 8);
    if (-1 < *(int *)(lVar5 + (long)in_R8D * 0x60 + 0x20 + (long)iVar7 * 4)) {
      FVar8 = get_fullmv_from_mv((MV *)(lVar14 + 0xa4 + (long)iVar7 * 4));
      local_64 = FVar8.row;
      iVar7 = in_ESI * 4 + (int)local_64;
      sStack_62 = FVar8.col;
      ref_pos = in_EDX * 4 + (int)sStack_62;
      bsize_pix = 4 << (""[in_CL] & 0x1f);
      bsize_pix_00 = 4 << (""[in_CL] & 0x1f);
      bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_CL];
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL];
      iVar9 = round_floor(iVar7,bsize_pix_00);
      iVar10 = round_floor(ref_pos,bsize_pix);
      if (cVar1 < '\0') {
        lVar5 = *(long *)(lVar14 + 8);
        local_f4 = *(int *)(lVar14 + 0x90);
      }
      else {
        lVar5 = *(long *)(lVar14 + 0x30 + (long)(int)(uint)((in_R9D != 0 ^ 0xffU) & 1) * 8);
        local_f4 = *(int *)(lVar14 + 0x9c + (long)(int)(uint)((in_R9D != 0 ^ 0xffU) & 1) * 4);
      }
      local_f4 = local_f4 << 4;
      srcrf_dist_00 = *(long *)(lVar14 + 0x18) - lVar5;
      lVar16 = (long)((double)*(long *)(lVar14 + 0x48) *
                     ((double)(*(long *)(lVar14 + 0x18) - lVar5) / (double)*(long *)(lVar14 + 0x18))
                     );
      iVar4 = *(int *)(lVar14 + 0x94);
      iVar17 = av1_delta_rate_cost(lVar5,(long)local_f4,srcrf_dist_00,(int)((ulong)lVar16 >> 0x20));
      for (local_8c = 0; (int)local_8c < 4; local_8c = local_8c + 1) {
        iVar11 = iVar9 * bsize_pix_00 + bsize_pix_00 * ((int)local_8c >> 1);
        iVar12 = iVar10 * bsize_pix + bsize_pix * (local_8c & 1);
        if ((((-1 < iVar11) && (iVar11 < *(int *)(lVar15 + 0x4c) * 4)) && (-1 < iVar12)) &&
           (iVar12 < *(int *)(lVar15 + 0x50) * 4)) {
          iVar13 = av1_get_overlap_area(iVar11,iVar12,iVar7,ref_pos,bsize_pix,bsize_pix_00);
          iVar11 = round_floor(iVar11,bsize_pix_00);
          iVar12 = round_floor(iVar12,bsize_pix);
          iVar11 = av1_tpl_ptr_pos(iVar11 * (uint)bVar2,iVar12 * (uint)bVar3,*(int *)(lVar15 + 0x40)
                                   ,right_shift);
          lVar14 = lVar6 + (long)iVar11 * 200;
          *(long *)(lVar14 + 0x48) =
               ((srcrf_dist_00 + lVar16) * (long)iVar13) / (long)(bsize_pix * bsize_pix_00) +
               *(long *)(lVar14 + 0x48);
          *(long *)(lVar14 + 0x40) =
               ((((long)(iVar4 << 4) - (long)local_f4) + iVar17) * (long)iVar13) /
               (long)(bsize_pix * bsize_pix_00) + *(long *)(lVar14 + 0x40);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void tpl_model_update_b(TplParams *const tpl_data, int mi_row,
                                      int mi_col, const BLOCK_SIZE bsize,
                                      int frame_idx, int ref) {
  TplDepFrame *tpl_frame_ptr = &tpl_data->tpl_frame[frame_idx];
  TplDepStats *tpl_ptr = tpl_frame_ptr->tpl_stats_ptr;
  TplDepFrame *tpl_frame = tpl_data->tpl_frame;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  TplDepStats *tpl_stats_ptr = &tpl_ptr[av1_tpl_ptr_pos(
      mi_row, mi_col, tpl_frame->stride, block_mis_log2)];

  int is_compound = tpl_stats_ptr->ref_frame_index[1] >= 0;

  if (tpl_stats_ptr->ref_frame_index[ref] < 0) return;
  const int ref_frame_index = tpl_stats_ptr->ref_frame_index[ref];
  TplDepFrame *ref_tpl_frame =
      &tpl_frame[tpl_frame[frame_idx].ref_map_index[ref_frame_index]];
  TplDepStats *ref_stats_ptr = ref_tpl_frame->tpl_stats_ptr;

  if (tpl_frame[frame_idx].ref_map_index[ref_frame_index] < 0) return;

  const FULLPEL_MV full_mv =
      get_fullmv_from_mv(&tpl_stats_ptr->mv[ref_frame_index].as_mv);
  const int ref_pos_row = mi_row * MI_SIZE + full_mv.row;
  const int ref_pos_col = mi_col * MI_SIZE + full_mv.col;

  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  const int mi_height = mi_size_high[bsize];
  const int mi_width = mi_size_wide[bsize];
  const int pix_num = bw * bh;

  // top-left on grid block location in pixel
  int grid_pos_row_base = round_floor(ref_pos_row, bh) * bh;
  int grid_pos_col_base = round_floor(ref_pos_col, bw) * bw;
  int block;

  int64_t srcrf_dist = is_compound ? tpl_stats_ptr->cmp_recrf_dist[!ref]
                                   : tpl_stats_ptr->srcrf_dist;
  int64_t srcrf_rate =
      is_compound
          ? (tpl_stats_ptr->cmp_recrf_rate[!ref] << TPL_DEP_COST_SCALE_LOG2)
          : (tpl_stats_ptr->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);

  int64_t cur_dep_dist = tpl_stats_ptr->recrf_dist - srcrf_dist;
  int64_t mc_dep_dist =
      (int64_t)(tpl_stats_ptr->mc_dep_dist *
                ((double)(tpl_stats_ptr->recrf_dist - srcrf_dist) /
                 tpl_stats_ptr->recrf_dist));
  int64_t delta_rate =
      (tpl_stats_ptr->recrf_rate << TPL_DEP_COST_SCALE_LOG2) - srcrf_rate;
  int64_t mc_dep_rate =
      av1_delta_rate_cost(tpl_stats_ptr->mc_dep_rate, tpl_stats_ptr->recrf_dist,
                          srcrf_dist, pix_num);

  for (block = 0; block < 4; ++block) {
    int grid_pos_row = grid_pos_row_base + bh * (block >> 1);
    int grid_pos_col = grid_pos_col_base + bw * (block & 0x01);

    if (grid_pos_row >= 0 && grid_pos_row < ref_tpl_frame->mi_rows * MI_SIZE &&
        grid_pos_col >= 0 && grid_pos_col < ref_tpl_frame->mi_cols * MI_SIZE) {
      int overlap_area = av1_get_overlap_area(grid_pos_row, grid_pos_col,
                                              ref_pos_row, ref_pos_col, bw, bh);
      int ref_mi_row = round_floor(grid_pos_row, bh) * mi_height;
      int ref_mi_col = round_floor(grid_pos_col, bw) * mi_width;
      assert((1 << block_mis_log2) == mi_height);
      assert((1 << block_mis_log2) == mi_width);
      TplDepStats *des_stats = &ref_stats_ptr[av1_tpl_ptr_pos(
          ref_mi_row, ref_mi_col, ref_tpl_frame->stride, block_mis_log2)];
      des_stats->mc_dep_dist +=
          ((cur_dep_dist + mc_dep_dist) * overlap_area) / pix_num;
      des_stats->mc_dep_rate +=
          ((delta_rate + mc_dep_rate) * overlap_area) / pix_num;
    }
  }
}